

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O1

int __thiscall embree::Distribution1D::init(Distribution1D *this,EVP_PKEY_CTX *ctx)

{
  vector<float,_std::allocator<float>_> *this_00;
  float fVar1;
  pointer pfVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_type in_RDX;
  float fVar6;
  undefined1 auVar7 [16];
  
  this->size = in_RDX;
  std::vector<float,_std::allocator<float>_>::resize(&this->PDF,in_RDX);
  this_00 = &this->CDF;
  std::vector<float,_std::allocator<float>_>::resize(this_00,this->size + 1);
  *(this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  sVar5 = this->size;
  if (sVar5 - 1 < 0xfffffffffffffffe) {
    uVar3 = 1;
    do {
      pfVar2 = (this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2[uVar3] = pfVar2[uVar3 - 1] + *(float *)(ctx + uVar3 * 4 + -4);
      uVar3 = uVar3 + 1;
      sVar5 = this->size;
    } while (uVar3 < sVar5 + 1);
  }
  fVar1 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar5];
  fVar6 = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    auVar7 = rcpss(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    fVar6 = (2.0 - fVar1 * auVar7._0_4_) * auVar7._0_4_;
  }
  uVar3 = this->size;
  if (uVar3 - 1 < 0xfffffffffffffffe) {
    uVar4 = 1;
    do {
      (this->PDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4 - 1] = *(float *)(ctx + uVar4 * 4 + -4) * fVar6 * (float)uVar3;
      pfVar2 = (this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2[uVar4] = pfVar2[uVar4] * fVar6;
      uVar4 = uVar4 + 1;
      uVar3 = this->size;
    } while (uVar4 < uVar3 + 1);
  }
  pfVar2 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2[uVar3] = 1.0;
  return (int)pfVar2;
}

Assistant:

void Distribution1D::init(const float* f, const size_t size_in)
  {
    /*! create arrays */
    size = size_in;
    PDF.resize(size);
    CDF.resize(size+1);

    /*! accumulate the function f */
    CDF[0] = 0.0f;
    for (size_t i=1; i<size+1; i++)
      CDF[i] = CDF[i-1] + f[i-1];

    /*! compute reciprocal sum */
    float rcpSum = CDF[size] == 0.0f ? 0.0f : rcp(CDF[size]);

    /*! normalize the probability distribution and cumulative distribution */
    for (size_t i = 1; i<size+1; i++) {
      PDF[i-1] = f[i-1] * rcpSum * size;
      CDF[i] *= rcpSum;
    }
    CDF[size] = 1.0f;
  }